

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

Builder * arangodb::velocypack::Collection::concat(Slice slice1,Slice slice2)

{
  Slice slice;
  Slice slice_00;
  int in_EDX;
  Builder *in_RDI;
  Builder *b;
  undefined1 in_stack_ffffffffffffffaf;
  Builder *this;
  Builder *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  this = in_RDI;
  Builder::Builder((Builder *)(ulong)in_stack_ffffffffffffffe0);
  Builder::openArray(this,(bool)in_stack_ffffffffffffffaf);
  slice._start._7_1_ = uVar1;
  slice._start._0_7_ = in_stack_ffffffffffffffe0;
  appendArray(in_stack_ffffffffffffffd8,slice);
  slice_00._start._7_1_ = uVar1;
  slice_00._start._0_7_ = in_stack_ffffffffffffffe0;
  appendArray(in_stack_ffffffffffffffd8,slice_00);
  Builder::close(in_RDI,in_EDX);
  return this;
}

Assistant:

Builder Collection::concat(Slice slice1, Slice slice2) {
  Builder b;
  b.openArray();
  appendArray(b, slice1);
  appendArray(b, slice2);
  b.close();

  return b;
}